

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabFilterMethod
              (sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nUnused,
              sqlite3_value **apVal)

{
  Fts5Index *p;
  Fts5Structure *pFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *pToken;
  uchar *puVar6;
  sqlite3_vtab *__dest;
  uchar *__src;
  sqlite3_value *pVal;
  sqlite3_value *pVal_00;
  int flags;
  sqlite3_value *pVal_01;
  bool bVar7;
  
  iVar4 = pCursor->pVtab[2].nRef;
  fts5VocabResetCursor((Fts5VocabCursor *)pCursor);
  bVar7 = ((uint)idxNum >> 8 & 1) != 0;
  if (bVar7) {
    pVal_01 = *apVal;
  }
  else {
    pVal_01 = (sqlite3_value *)0x0;
  }
  uVar2 = (uint)bVar7;
  if (((uint)idxNum >> 9 & 1) == 0) {
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    uVar2 = uVar2 + 1;
    pVal_00 = apVal[bVar7];
  }
  if (((uint)idxNum >> 10 & 1) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar2];
  }
  *(uint *)&pCursor[8].pVtab = idxNum & 0xff;
  if (pVal_01 == (sqlite3_value *)0x0) {
    if (pVal_00 == (sqlite3_value *)0x0) {
      pToken = (uchar *)0x0;
      iVar3 = 0;
    }
    else {
      pToken = sqlite3_value_text(pVal_00);
      iVar3 = sqlite3_value_bytes(pVal_00);
    }
    flags = 8;
    if (pVal != (sqlite3_value *)0x0) {
      puVar6 = sqlite3_value_text(pVal);
      iVar5 = sqlite3_value_bytes(pVal);
      *(int *)&pCursor[6].pVtab = iVar5;
      __dest = (sqlite3_vtab *)sqlite3_malloc(iVar5 + 1);
      pCursor[7].pVtab = __dest;
      if (__dest == (sqlite3_vtab *)0x0) {
        return 7;
      }
      __src = "";
      if (puVar6 != (uchar *)0x0) {
        __src = puVar6;
      }
      memcpy(__dest,__src,(long)*(int *)&pCursor[6].pVtab + 1);
    }
  }
  else {
    pToken = sqlite3_value_text(pVal_01);
    iVar3 = sqlite3_value_bytes(pVal_01);
    flags = 0x80;
  }
  p = *(Fts5Index **)&pCursor[2].pVtab[1].nRef;
  iVar3 = sqlite3Fts5IndexQuery
                    (p,(char *)pToken,iVar3,flags,(Fts5Colset *)0x0,(Fts5IndexIter **)(pCursor + 4))
  ;
  if (iVar3 == 0) {
    pFVar1 = p->pStruct;
    pFVar1->nRef = pFVar1->nRef + 1;
    pCursor[5].pVtab = (sqlite3_vtab *)pFVar1;
    if (iVar4 == 2) {
      iVar3 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
      if (((iVar3 == 0) && (iVar3 = 0, *(int *)&pCursor[3].pVtab == 0)) &&
         (*(int *)((long)&(pCursor[2].pVtab[1].pModule)->xBegin + 4) != 1)) {
LAB_001d765c:
        iVar4 = fts5VocabNextMethod(pCursor);
        return iVar4;
      }
    }
    else {
      iVar3 = 0;
      if (*(int *)&pCursor[3].pVtab == 0) goto LAB_001d765c;
    }
  }
  return iVar3;
}

Assistant:

static int fts5VocabFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nUnused,                    /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eType = pTab->eType;
  int rc = SQLITE_OK;

  int iVal = 0;
  int f = FTS5INDEX_QUERY_SCAN;
  const char *zTerm = 0;
  int nTerm = 0;

  sqlite3_value *pEq = 0;
  sqlite3_value *pGe = 0;
  sqlite3_value *pLe = 0;

  UNUSED_PARAM2(zUnused, nUnused);

  fts5VocabResetCursor(pCsr);
  if( idxNum & FTS5_VOCAB_TERM_EQ ) pEq = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_GE ) pGe = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_LE ) pLe = apVal[iVal++];
  pCsr->colUsed = (idxNum & FTS5_VOCAB_COLUSED_MASK);

  if( pEq ){
    zTerm = (const char *)sqlite3_value_text(pEq);
    nTerm = sqlite3_value_bytes(pEq);
    f = FTS5INDEX_QUERY_NOTOKENDATA;
  }else{
    if( pGe ){
      zTerm = (const char *)sqlite3_value_text(pGe);
      nTerm = sqlite3_value_bytes(pGe);
    }
    if( pLe ){
      const char *zCopy = (const char *)sqlite3_value_text(pLe);
      if( zCopy==0 ) zCopy = "";
      pCsr->nLeTerm = sqlite3_value_bytes(pLe);
      pCsr->zLeTerm = sqlite3_malloc(pCsr->nLeTerm+1);
      if( pCsr->zLeTerm==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memcpy(pCsr->zLeTerm, zCopy, pCsr->nLeTerm+1);
      }
    }
  }

  if( rc==SQLITE_OK ){
    Fts5Index *pIndex = pCsr->pFts5->pIndex;
    rc = sqlite3Fts5IndexQuery(pIndex, zTerm, nTerm, f, 0, &pCsr->pIter);
    if( rc==SQLITE_OK ){
      pCsr->pStruct = sqlite3Fts5StructureRef(pIndex);
    }
  }
  if( rc==SQLITE_OK && eType==FTS5_VOCAB_INSTANCE ){
    rc = fts5VocabInstanceNewTerm(pCsr);
  }
  if( rc==SQLITE_OK && !pCsr->bEof
   && (eType!=FTS5_VOCAB_INSTANCE
    || pCsr->pFts5->pConfig->eDetail!=FTS5_DETAIL_NONE)
  ){
    rc = fts5VocabNextMethod(pCursor);
  }

  return rc;
}